

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O1

uint64_t lzma_block_buffer_bound64(uint64_t uncompressed_size)

{
  uint64_t uVar1;
  ulong uVar2;
  long lVar3;
  
  if (uncompressed_size < 0x7ffffffffffffbbd) {
    uVar2 = uncompressed_size + 0xffff >> 0x10;
    lVar3 = 0;
    if (uncompressed_size <= uVar2 * -3 + 0x7ffffffffffffbbb) {
      lVar3 = uncompressed_size + 1 + uVar2 * 3;
    }
  }
  else {
    lVar3 = 0;
  }
  uVar1 = (lVar3 + 3U & 0xfffffffffffffffc) + 0x5c;
  if (lVar3 == 0) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

extern uint64_t
lzma_block_buffer_bound64(uint64_t uncompressed_size)
{
	// If the data doesn't compress, we always use uncompressed
	// LZMA2 chunks.
	uint64_t lzma2_size = lzma2_bound(uncompressed_size);
	if (lzma2_size == 0)
		return 0;

	// Take Block Padding into account.
	lzma2_size = (lzma2_size + 3) & ~UINT64_C(3);

	// No risk of integer overflow because lzma2_bound() already takes
	// into account the size of the headers in the Block.
	return HEADERS_BOUND + lzma2_size;
}